

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerHLSL::emit_struct_member
          (CompilerHLSL *this,SPIRType *type,uint32_t member_type_id,uint32_t index,
          string *qualifier,uint32_t base_offset)

{
  __node_base_ptr p_Var1;
  bool bVar2;
  uint32_t id;
  mapped_type *pmVar3;
  Vector<Decoration> *this_00;
  size_t sVar4;
  Decoration *pDVar5;
  CompilerError *this_01;
  bool local_1f2;
  bool local_1da;
  undefined1 local_1b8 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178 [36];
  uint local_154;
  spirv_cross local_150 [38];
  char local_12a;
  allocator local_129;
  string local_128 [36];
  uint local_104;
  uint32_t local_100;
  uint32_t offset;
  string local_f8 [7];
  bool is_push_constant;
  string packing_offset;
  string local_d8 [39];
  bool local_b1;
  string local_b0 [7];
  bool is_block;
  string qualifiers;
  Vector<Decoration> *memb;
  Bitset memberflags;
  SPIRType *membertype;
  uint32_t base_offset_local;
  string *qualifier_local;
  uint32_t index_local;
  uint32_t member_type_id_local;
  SPIRType *type_local;
  CompilerHLSL *this_local;
  
  memberflags.higher._M_h._M_single_bucket =
       (__node_base_ptr)Compiler::get<spirv_cross::SPIRType>((Compiler *)this,member_type_id);
  Bitset::Bitset((Bitset *)&memb);
  pmVar3 = ::std::
           unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
           ::operator[](&(this->super_CompilerGLSL).super_Compiler.ir.meta,
                        &(type->super_IVariant).self);
  this_00 = &pmVar3->members;
  sVar4 = VectorView<spirv_cross::Meta::Decoration>::size
                    (&this_00->super_VectorView<spirv_cross::Meta::Decoration>);
  if (index < sVar4) {
    pDVar5 = VectorView<spirv_cross::Meta::Decoration>::operator[]
                       (&this_00->super_VectorView<spirv_cross::Meta::Decoration>,(ulong)index);
    Bitset::operator=((Bitset *)&memb,&pDVar5->decoration_flags);
  }
  ::std::__cxx11::string::string(local_b0);
  pmVar3 = ::std::
           unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
           ::operator[](&(this->super_CompilerGLSL).super_Compiler.ir.meta,
                        &(type->super_IVariant).self);
  bVar2 = Bitset::get(&(pmVar3->decoration).decoration_flags,2);
  local_1da = true;
  if (!bVar2) {
    pmVar3 = ::std::
             unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
             ::operator[](&(this->super_CompilerGLSL).super_Compiler.ir.meta,
                          &(type->super_IVariant).self);
    local_1da = Bitset::get(&(pmVar3->decoration).decoration_flags,3);
  }
  local_b1 = local_1da;
  if (local_1da != false) {
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x2e])(local_d8,this,&memb);
    ::std::__cxx11::string::operator=(local_b0,local_d8);
    ::std::__cxx11::string::~string(local_d8);
  }
  ::std::__cxx11::string::string(local_f8);
  offset._3_1_ = type->storage == StorageClassPushConstant;
  id = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
  bVar2 = Compiler::has_extended_decoration((Compiler *)this,id,SPIRVCrossDecorationExplicitOffset);
  if ((bVar2) || (local_1f2 = false, (offset._3_1_ & 1) != 0)) {
    local_100 = (uint32_t)TypedID::operator_cast_to_TypedID((TypedID *)&(type->super_IVariant).self)
    ;
    local_1f2 = Compiler::has_member_decoration
                          ((Compiler *)this,(TypeID)local_100,index,DecorationOffset);
  }
  if (local_1f2 != false) {
    pDVar5 = VectorView<spirv_cross::Meta::Decoration>::operator[]
                       (&this_00->super_VectorView<spirv_cross::Meta::Decoration>,(ulong)index);
    local_104 = pDVar5->offset - base_offset;
    if ((local_104 & 3) != 0) {
      local_12a = '\x01';
      this_01 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_128,"Cannot pack on tighter bounds than 4 bytes in HLSL.",&local_129);
      CompilerError::CompilerError(this_01,(string *)local_128);
      local_12a = '\0';
      __cxa_throw(this_01,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    local_154 = local_104 >> 4;
    join<char_const(&)[16],unsigned_int,char_const*&,char_const(&)[2]>
              (local_150,(char (*) [16])" : packoffset(c",&local_154,
               (char **)((long)emit_struct_member::packing_swizzle + (ulong)(local_104 & 0xc) * 2),
               (char (*) [2])0x4dff7a);
    ::std::__cxx11::string::operator=(local_f8,(string *)local_150);
    ::std::__cxx11::string::~string((string *)local_150);
  }
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x2d])
            (local_178,this,type,(ulong)index);
  p_Var1 = memberflags.higher._M_h._M_single_bucket;
  CompilerGLSL::to_member_name_abi_cxx11_((CompilerGLSL *)local_1b8,(SPIRType *)this,(uint32_t)type)
  ;
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1a])
            (local_1b8 + 0x20,this,p_Var1,local_1b8,0);
  CompilerGLSL::
  statement<std::__cxx11::string,std::__cxx11::string&,std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string&,char_const(&)[2]>
            (&this->super_CompilerGLSL,local_178,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,qualifier
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (local_1b8 + 0x20),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
             (char (*) [2])0x4d9ce2);
  ::std::__cxx11::string::~string((string *)(local_1b8 + 0x20));
  ::std::__cxx11::string::~string((string *)local_1b8);
  ::std::__cxx11::string::~string((string *)local_178);
  ::std::__cxx11::string::~string(local_f8);
  ::std::__cxx11::string::~string(local_b0);
  Bitset::~Bitset((Bitset *)&memb);
  return;
}

Assistant:

void CompilerHLSL::emit_struct_member(const SPIRType &type, uint32_t member_type_id, uint32_t index,
                                      const string &qualifier, uint32_t base_offset)
{
	auto &membertype = get<SPIRType>(member_type_id);

	Bitset memberflags;
	auto &memb = ir.meta[type.self].members;
	if (index < memb.size())
		memberflags = memb[index].decoration_flags;

	string qualifiers;
	bool is_block = ir.meta[type.self].decoration.decoration_flags.get(DecorationBlock) ||
	                ir.meta[type.self].decoration.decoration_flags.get(DecorationBufferBlock);

	if (is_block)
		qualifiers = to_interpolation_qualifiers(memberflags);

	string packing_offset;
	bool is_push_constant = type.storage == StorageClassPushConstant;

	if ((has_extended_decoration(type.self, SPIRVCrossDecorationExplicitOffset) || is_push_constant) &&
	    has_member_decoration(type.self, index, DecorationOffset))
	{
		uint32_t offset = memb[index].offset - base_offset;
		if (offset & 3)
			SPIRV_CROSS_THROW("Cannot pack on tighter bounds than 4 bytes in HLSL.");

		static const char *packing_swizzle[] = { "", ".y", ".z", ".w" };
		packing_offset = join(" : packoffset(c", offset / 16, packing_swizzle[(offset & 15) >> 2], ")");
	}

	statement(layout_for_member(type, index), qualifiers, qualifier,
	          variable_decl(membertype, to_member_name(type, index)), packing_offset, ";");
}